

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_overflow_strings_to_disk.cpp
# Opt level: O2

shared_ptr<duckdb::BlockHandle,_true> __thiscall
duckdb::UncompressedStringSegmentState::GetHandle
          (UncompressedStringSegmentState *this,BlockManager *manager_p,block_id_t block_id)

{
  iterator iVar1;
  key_type_conflict2 in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::BlockHandle,_true> sVar2;
  key_type_conflict2 local_50;
  key_type_conflict2 local_48;
  __shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_50 = in_RCX;
  ::std::mutex::lock((mutex *)&manager_p->metadata_manager);
  iVar1 = ::std::
          _Hashtable<long,_std::pair<const_long,_duckdb::shared_ptr<duckdb::BlockHandle,_true>_>,_std::allocator<std::pair<const_long,_duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<long,_std::pair<const_long,_duckdb::shared_ptr<duckdb::BlockHandle,_true>_>,_std::allocator<std::pair<const_long,_duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)&manager_p[1].blocks_lock,&local_50);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_long,_duckdb::shared_ptr<duckdb::BlockHandle,_true>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    if ((manager_p->blocks)._M_h._M_element_count != 0) {
      block_id = (block_id_t)
                 optional_ptr<duckdb::BlockManager,_true>::operator*
                           ((optional_ptr<duckdb::BlockManager,_true> *)
                            &(manager_p->blocks)._M_h._M_element_count);
    }
    BlockManager::RegisterBlock((BlockManager *)this,block_id);
    local_48 = local_50;
    ::std::__shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,(__shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2> *)this);
    ::std::
    _Hashtable<long,std::pair<long_const,duckdb::shared_ptr<duckdb::BlockHandle,true>>,std::allocator<std::pair<long_const,duckdb::shared_ptr<duckdb::BlockHandle,true>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<long,duckdb::shared_ptr<duckdb::BlockHandle,true>>>
              ((_Hashtable<long,std::pair<long_const,duckdb::shared_ptr<duckdb::BlockHandle,true>>,std::allocator<std::pair<long_const,duckdb::shared_ptr<duckdb::BlockHandle,true>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&manager_p[1].blocks_lock,&local_48);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  else {
    ::std::__shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)iVar1.
                      super__Node_iterator_base<std::pair<const_long,_duckdb::shared_ptr<duckdb::BlockHandle,_true>_>,_false>
                      ._M_cur + 0x10));
  }
  pthread_mutex_unlock((pthread_mutex_t *)&manager_p->metadata_manager);
  sVar2.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::BlockHandle,_true>)
         sVar2.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BlockHandle> UncompressedStringSegmentState::GetHandle(BlockManager &manager_p, block_id_t block_id) {
	lock_guard<mutex> lock(block_lock);
	auto entry = handles.find(block_id);
	if (entry != handles.end()) {
		return entry->second;
	}
	auto &manager = block_manager ? *block_manager : manager_p;
	auto result = manager.RegisterBlock(block_id);
	handles.insert(make_pair(block_id, result));
	return result;
}